

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O1

uint nullcGetBytecode(char **bytecode)

{
  uint uVar1;
  int iVar2;
  TraceScope traceScope;
  TraceScope local_20;
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    uVar1 = 0;
  }
  else {
    if (nullcGetBytecode::token == '\0') {
      iVar2 = __cxa_guard_acquire(&nullcGetBytecode::token);
      if (iVar2 != 0) {
        nullcGetBytecode::token = NULLC::TraceGetToken("nullc","nullcGetBytecode");
        __cxa_guard_release(&nullcGetBytecode::token);
      }
    }
    NULLC::TraceScope::TraceScope(&local_20,nullcGetBytecode::token);
    if (NULLC::compilerCtx == (CompilerContext *)0x0) {
      NULLC::nullcLastError = "ERROR: there is no active compiler context";
      uVar1 = 0;
    }
    else {
      uVar1 = GetBytecode(NULLC::compilerCtx,bytecode);
      BinaryCache::LastBytecode(*bytecode);
    }
    NULLC::TraceScope::~TraceScope(&local_20);
  }
  return uVar1;
}

Assistant:

unsigned nullcGetBytecode(char **bytecode)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(0);

	TRACE_SCOPE("nullc", "nullcGetBytecode");

	if(!compilerCtx)
	{
		nullcLastError = "ERROR: there is no active compiler context";
		return 0;
	}

	unsigned size = GetBytecode(*compilerCtx, bytecode);

	// Load it into cache
	BinaryCache::LastBytecode(*bytecode);
	return size;
}